

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.h
# Opt level: O1

int bloaty::dwarf::ReadLEB128<int>(string_view *data)

{
  uint64_t uVar1;
  
  uVar1 = ReadLEB128Internal(true,data);
  if ((long)(int)uVar1 == uVar1) {
    return (int)uVar1;
  }
  Throw("DWARF data contained larger LEB128 than we were expecting",0x25);
}

Assistant:

T ReadLEB128(std::string_view* data) {
  typedef typename std::conditional<std::is_signed<T>::value, int64_t,
                                    uint64_t>::type Int64Type;
  Int64Type val = ReadLEB128Internal(std::is_signed<T>::value, data);
  if (val > std::numeric_limits<T>::max() ||
      val < std::numeric_limits<T>::min()) {
    THROW("DWARF data contained larger LEB128 than we were expecting");
  }
  return static_cast<T>(val);
}